

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O1

void remove_subset_prefix(FT_String *name)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  
  sVar2 = strlen(name);
  iVar4 = (int)sVar2 + 1;
  do {
    bVar1 = true;
    if ((6 < iVar4) && (name[6] == '+')) {
      bVar1 = true;
      lVar3 = 0;
      do {
        if (0x19 < (byte)(name[lVar3] + 0xbfU)) {
          bVar1 = false;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      if (bVar1) {
        if (iVar4 != 7) {
          memmove(name,name + 7,(ulong)(iVar4 - 7));
        }
        iVar4 = iVar4 + -7;
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
  } while (!bVar1);
  return;
}

Assistant:

static void
  remove_subset_prefix( FT_String*  name )
  {
    FT_Int32  idx             = 0;
    FT_Int32  length          = (FT_Int32)ft_strlen( name ) + 1;
    FT_Bool   continue_search = 1;


    while ( continue_search )
    {
      if ( length >= 7 && name[6] == '+' )
      {
        for ( idx = 0; idx < 6; idx++ )
        {
          /* ASCII uppercase letters */
          if ( !( 'A' <= name[idx] && name[idx] <= 'Z' ) )
            continue_search = 0;
        }

        if ( continue_search )
        {
          for ( idx = 7; idx < length; idx++ )
            name[idx - 7] = name[idx];
          length -= 7;
        }
      }
      else
        continue_search = 0;
    }
  }